

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O1

WebPMuxError ChunkSetHead(WebPChunk *chunk,WebPChunk **chunk_list)

{
  uint8_t *puVar1;
  WebPChunk *pWVar2;
  uint32_t uVar3;
  int iVar4;
  WebPMuxError WVar5;
  WebPChunk *pWVar6;
  
  if (*chunk_list != (WebPChunk *)0x0) {
    return WEBP_MUX_NOT_FOUND;
  }
  pWVar6 = (WebPChunk *)WebPSafeMalloc(1,0x20);
  if (pWVar6 == (WebPChunk *)0x0) {
    WVar5 = WEBP_MUX_MEMORY_ERROR;
  }
  else {
    uVar3 = chunk->tag_;
    iVar4 = chunk->owner_;
    puVar1 = (chunk->data_).bytes;
    pWVar2 = chunk->next_;
    (pWVar6->data_).size = (chunk->data_).size;
    pWVar6->next_ = pWVar2;
    pWVar6->tag_ = uVar3;
    pWVar6->owner_ = iVar4;
    (pWVar6->data_).bytes = puVar1;
    chunk->owner_ = 0;
    pWVar6->next_ = (WebPChunk *)0x0;
    *chunk_list = pWVar6;
    WVar5 = WEBP_MUX_OK;
  }
  return WVar5;
}

Assistant:

WebPMuxError ChunkSetHead(WebPChunk* const chunk,
                          WebPChunk** const chunk_list) {
  WebPChunk* new_chunk;

  assert(chunk_list != NULL);
  if (*chunk_list != NULL) {
    return WEBP_MUX_NOT_FOUND;
  }

  new_chunk = (WebPChunk*)WebPSafeMalloc(1ULL, sizeof(*new_chunk));
  if (new_chunk == NULL) return WEBP_MUX_MEMORY_ERROR;
  *new_chunk = *chunk;
  chunk->owner_ = 0;
  new_chunk->next_ = NULL;
  *chunk_list = new_chunk;
  return WEBP_MUX_OK;
}